

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio_impl.cpp
# Opt level: O2

void __thiscall ui::Gpio::Fetch(Gpio *this)

{
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  istream local_220 [520];
  
  __lhs = &this->path_;
  std::operator+(&local_240,__lhs,"/label");
  std::ifstream::ifstream(local_220,(string *)&local_240,_S_in);
  std::operator>>(local_220,(string *)&this->label_);
  std::ifstream::~ifstream(local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::operator+(&local_240,__lhs,"/edge");
  std::ifstream::ifstream(local_220,(string *)&local_240,_S_in);
  std::operator>>(local_220,(string *)&this->edge_);
  std::ifstream::~ifstream(local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::operator+(&local_240,__lhs,"/direction");
  std::ifstream::ifstream(local_220,(string *)&local_240,_S_in);
  std::operator>>(local_220,(string *)&this->direction_);
  std::ifstream::~ifstream(local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::operator+(&local_240,__lhs,"/value");
  std::ifstream::ifstream(local_220,(string *)&local_240,_S_in);
  std::operator>>(local_220,(string *)&this->value_);
  std::ifstream::~ifstream(local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::operator+(&local_240,__lhs,"/active_low");
  std::ifstream::ifstream(local_220,(string *)&local_240,_S_in);
  std::operator>>(local_220,(string *)&this->active_low_);
  std::ifstream::~ifstream(local_220);
  std::__cxx11::string::~string((string *)&local_240);
  return;
}

Assistant:

void Fetch() {
    std::ifstream(path_ + "/label") >> label_;
    std::ifstream(path_ + "/edge") >> edge_;
    std::ifstream(path_ + "/direction") >> direction_;
    std::ifstream(path_ + "/value") >> value_;
    std::ifstream(path_ + "/active_low") >> active_low_;
  }